

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  int iVar2;
  Mat *pMVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Mat *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  Mat *in_stack_00000020;
  float w_1;
  float val_1;
  int k_1;
  float *sptr_1;
  int q;
  float *kptr_1;
  float sum_1;
  int j_1;
  float *weight_data_ptr;
  float *outptr_1;
  int p;
  int g_1;
  int outh_g;
  int h_g;
  float w;
  float val;
  int k;
  float *sptr;
  float sum;
  int j;
  float *kptr;
  float *outptr;
  int g;
  int bias_term;
  int outh;
  int outw;
  int h;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  float local_12c;
  int local_114;
  float *local_110;
  int local_104;
  float *local_100;
  float local_f8;
  int local_f4;
  int local_dc;
  int local_d8;
  int local_c4;
  float *local_c0;
  float local_b8;
  int local_b4;
  int local_9c;
  float local_30;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  iVar5 = in_RDI->h;
  iVar2 = in_RSI->w;
  iVar6 = in_RSI->h;
  bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  if ((iVar5 == in_stack_00000010) && (in_stack_00000010 == iVar6)) {
    for (local_9c = 0; local_9c < in_stack_00000010; local_9c = local_9c + 1) {
      pfVar7 = Mat::row(in_RSI,local_9c);
      pfVar8 = Mat::operator_cast_to_float_(in_RDX);
      for (local_b4 = 0; local_b4 < iVar2; local_b4 = local_b4 + 1) {
        local_b8 = 0.0;
        if (!bVar4) {
          pfVar9 = Mat::operator[](in_RCX,(long)local_9c);
          local_b8 = *pfVar9;
        }
        local_c0 = Mat::row(in_RDI,local_9c);
        pMVar3 = in_stack_00000020;
        local_c0 = local_c0 + local_b4 * in_R9D;
        for (local_c4 = 0; local_c4 < in_R8D; local_c4 = local_c4 + 1) {
          local_b8 = *local_c0 * pfVar8[(long)(in_R8D * local_9c) + (long)local_c4] + local_b8;
          local_c0 = local_c0 + in_stack_00000008;
        }
        local_4 = local_b8;
        switch(in_stack_00000018) {
        case 1:
          dVar11 = std::fmax((double)(ulong)(uint)local_b8,0.0);
          local_4 = SUB84(dVar11,0);
          break;
        case 2:
          pfVar9 = Mat::operator[](in_stack_00000020,0);
          if (local_b8 <= 0.0) {
            local_12c = local_b8 * *pfVar9;
          }
          else {
            local_12c = local_b8;
          }
          local_4 = local_12c;
          break;
        case 3:
          pfVar9 = Mat::operator[](in_stack_00000020,0);
          fVar1 = *pfVar9;
          pfVar9 = Mat::operator[](pMVar3,1);
          if (local_b8 < fVar1) {
            local_4 = fVar1;
          }
          if (*pfVar9 < local_4) {
            local_4 = *pfVar9;
          }
          break;
        case 4:
          dVar11 = std::exp((double)(ulong)(uint)-local_b8);
          local_4 = 1.0 / (SUB84(dVar11,0) + 1.0);
          break;
        case 5:
          auVar12._0_8_ = std::exp((double)(ulong)(uint)local_b8);
          auVar12._8_8_ = extraout_XMM0_Qb;
          auVar13._4_12_ = auVar12._4_12_;
          auVar13._0_4_ = SUB84(auVar12._0_8_,0) + 1.0;
          dVar11 = std::log(auVar13._0_8_);
          dVar11 = std::tanh(dVar11);
          local_4 = local_b8 * SUB84(dVar11,0);
          break;
        case 6:
          pfVar9 = Mat::operator[](in_stack_00000020,0);
          fVar1 = *pfVar9;
          pfVar9 = Mat::operator[](pMVar3,1);
          fVar10 = -*pfVar9 / fVar1;
          if (fVar10 <= local_b8) {
            if (local_b8 <= 1.0 / fVar1 + fVar10) {
              local_4 = local_b8 * (local_b8 * fVar1 + *pfVar9);
            }
          }
          else {
            local_4 = 0.0;
          }
        }
        pfVar7[local_b4] = local_4;
      }
    }
  }
  else {
    iVar5 = iVar5 / in_stack_00000010;
    iVar6 = iVar6 / in_stack_00000010;
    for (local_d8 = 0; local_d8 < in_stack_00000010; local_d8 = local_d8 + 1) {
      for (local_dc = 0; local_dc < iVar6; local_dc = local_dc + 1) {
        pfVar7 = Mat::row(in_RSI,local_d8 * iVar6 + local_dc);
        pfVar8 = Mat::operator_cast_to_float_(in_RDX);
        for (local_f4 = 0; local_f4 < iVar2; local_f4 = local_f4 + 1) {
          local_f8 = 0.0;
          if (!bVar4) {
            pfVar9 = Mat::operator[](in_RCX,(long)(iVar6 * local_d8 + local_dc));
            local_f8 = *pfVar9;
          }
          local_100 = pfVar8 + (long)(in_R8D * iVar5 * iVar6 * local_d8) +
                               (long)(in_R8D * iVar5 * local_dc);
          for (local_104 = 0; pMVar3 = in_stack_00000020, local_104 < iVar5;
              local_104 = local_104 + 1) {
            local_110 = Mat::row(in_RDI,iVar5 * local_d8 + local_104);
            local_110 = local_110 + local_f4 * in_R9D;
            for (local_114 = 0; local_114 < in_R8D; local_114 = local_114 + 1) {
              local_f8 = *local_110 * local_100[local_114] + local_f8;
              local_110 = local_110 + in_stack_00000008;
            }
            local_100 = local_100 + in_R8D;
          }
          local_30 = local_f8;
          switch(in_stack_00000018) {
          case 1:
            dVar11 = std::fmax((double)(ulong)(uint)local_f8,0.0);
            local_30 = SUB84(dVar11,0);
            break;
          case 2:
            pfVar9 = Mat::operator[](in_stack_00000020,0);
            local_30 = local_f8;
            if (local_f8 <= 0.0) {
              local_30 = local_f8 * *pfVar9;
            }
            break;
          case 3:
            pfVar9 = Mat::operator[](in_stack_00000020,0);
            fVar1 = *pfVar9;
            pfVar9 = Mat::operator[](pMVar3,1);
            if (local_f8 < fVar1) {
              local_30 = fVar1;
            }
            if (*pfVar9 < local_30) {
              local_30 = *pfVar9;
            }
            break;
          case 4:
            dVar11 = std::exp((double)(ulong)(uint)-local_f8);
            local_30 = 1.0 / (SUB84(dVar11,0) + 1.0);
            break;
          case 5:
            auVar14._0_8_ = std::exp((double)(ulong)(uint)local_f8);
            auVar14._8_8_ = extraout_XMM0_Qb_00;
            auVar15._4_12_ = auVar14._4_12_;
            auVar15._0_4_ = SUB84(auVar14._0_8_,0) + 1.0;
            dVar11 = std::log(auVar15._0_8_);
            dVar11 = std::tanh(dVar11);
            local_30 = local_f8 * SUB84(dVar11,0);
            break;
          case 6:
            pfVar9 = Mat::operator[](in_stack_00000020,0);
            fVar1 = *pfVar9;
            pfVar9 = Mat::operator[](pMVar3,1);
            fVar10 = -*pfVar9 / fVar1;
            if (fVar10 <= local_f8) {
              if (local_f8 <= 1.0 / fVar1 + fVar10) {
                local_30 = local_f8 * (local_f8 * fVar1 + *pfVar9);
              }
            }
            else {
              local_30 = 0.0;
            }
          }
          pfVar7[local_f4] = local_30;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}